

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_ngon.cpp
# Opt level: O2

char * ToStringHelper(uint *a,uint count,char *dst_str,char *dst_str_end)

{
  char *pcVar1;
  ulong uVar2;
  char *src_str;
  ulong uVar3;
  
  pcVar1 = ToStringHelper("[",dst_str,dst_str_end);
  pcVar1 = ToStringHelper(count,pcVar1,dst_str_end);
  pcVar1 = ToStringHelper("]=",pcVar1,dst_str_end);
  if (a == (uint *)0x0) {
    src_str = "null";
  }
  else {
    pcVar1 = ToStringHelper("(",pcVar1,dst_str_end);
    if (count == 0xffffffff) {
      pcVar1 = ToStringHelper("?",pcVar1,dst_str_end);
    }
    else {
      uVar3 = 4;
      if (count < 8) {
        uVar3 = (ulong)count;
      }
      for (uVar2 = 0; uVar3 != uVar2; uVar2 = uVar2 + 1) {
        if (uVar2 != 0) {
          pcVar1 = ToStringHelper(",",pcVar1,dst_str_end);
        }
        pcVar1 = ToStringHelper(a[uVar2],pcVar1,dst_str_end);
      }
      if (7 < count) {
        pcVar1 = ToStringHelper(",...,",pcVar1,dst_str_end);
        pcVar1 = ToStringHelper(a[count - 1],pcVar1,dst_str_end);
      }
    }
    src_str = ")";
  }
  pcVar1 = ToStringHelper(src_str,pcVar1,dst_str_end);
  return pcVar1;
}

Assistant:

static char* ToStringHelper( const unsigned int* a, unsigned int count, char* dst_str, const char* dst_str_end )
{
  unsigned int i, imax;

  dst_str = ToStringHelper("[",dst_str,dst_str_end);
  dst_str = ToStringHelper(count,dst_str,dst_str_end);
  dst_str = ToStringHelper("]=",dst_str,dst_str_end);
  if ( 0 == a )
    dst_str = ToStringHelper("null",dst_str,dst_str_end);
  else
  {
    dst_str = ToStringHelper("(",dst_str,dst_str_end);
    if ( ON_UNSET_UINT_INDEX == count )
    {
      dst_str = ToStringHelper("?",dst_str,dst_str_end);
    }
    else
    {
      imax = (count <= 7 ? count : 4 );
      for ( i = 0; i < imax; i++ )
      {
        if ( i )
          dst_str = ToStringHelper(",",dst_str,dst_str_end);
        dst_str = ToStringHelper(a[i],dst_str,dst_str_end);
      }
      if ( i < count )
      {
        dst_str = ToStringHelper(",...,",dst_str,dst_str_end);
        dst_str = ToStringHelper(a[count-1],dst_str,dst_str_end);
      }
    }
    dst_str = ToStringHelper(")",dst_str,dst_str_end);
  }

  return dst_str;
}